

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O3

int secp256k1_ecdsa_sig_sign
              (secp256k1_ecmult_gen_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_scalar *seckey,secp256k1_scalar *message,secp256k1_scalar *nonce,int *recid)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint uVar10;
  undefined4 extraout_EAX;
  int iVar11;
  int iVar12;
  uint flag;
  long lVar13;
  long lVar14;
  ulong uVar15;
  secp256k1_scalar *b_00;
  byte bVar16;
  long lVar17;
  secp256k1_gej *r_00;
  secp256k1_fe *a;
  secp256k1_ge *r_01;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  unsigned_long _zzq_result;
  secp256k1_ge r;
  unsigned_long _zzq_args [6];
  secp256k1_scalar n;
  uchar b [32];
  secp256k1_gej rp;
  undefined1 auStack_350 [16];
  undefined1 auStack_340 [16];
  undefined1 auStack_330 [16];
  undefined1 auStack_320 [16];
  secp256k1_fe *psStack_308;
  secp256k1_fe *psStack_300;
  ulong uStack_2f8;
  secp256k1_fe sStack_2f0;
  undefined1 auStack_2c0 [32];
  undefined1 auStack_2a0 [16];
  secp256k1_fe sStack_290;
  undefined1 auStack_250 [16];
  undefined1 auStack_240 [16];
  undefined4 uStack_230;
  undefined1 auStack_220 [40];
  secp256k1_scalar *psStack_1f8;
  secp256k1_scalar *psStack_1f0;
  int *piStack_1e8;
  secp256k1_scalar *psStack_1e0;
  ulong uStack_1d8;
  secp256k1_ge *psStack_1d0;
  undefined8 local_1c8;
  uint local_1bc;
  secp256k1_scalar *local_1b8;
  secp256k1_scalar *local_1b0;
  secp256k1_ge local_1a8;
  undefined8 local_138;
  secp256k1_ge *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  secp256k1_scalar local_108;
  undefined1 local_e8 [184];
  
  local_1bc = 0;
  psStack_1d0 = (secp256k1_ge *)0x14adef;
  local_1b8 = seckey;
  local_1b0 = message;
  secp256k1_ecmult_gen(ctx,(secp256k1_gej *)(local_e8 + 0x20),nonce);
  psStack_1d0 = (secp256k1_ge *)0x14adff;
  secp256k1_ge_set_gej(&local_1a8,(secp256k1_gej *)(local_e8 + 0x20));
  psStack_1d0 = (secp256k1_ge *)0x14ae07;
  secp256k1_fe_normalize(&local_1a8.x);
  psStack_1d0 = (secp256k1_ge *)0x14ae11;
  secp256k1_fe_normalize(&local_1a8.y);
  r_00 = (secp256k1_gej *)local_e8;
  psStack_1d0 = (secp256k1_ge *)0x14ae24;
  secp256k1_fe_get_b32((uchar *)r_00,&local_1a8.x);
  psStack_1d0 = (secp256k1_ge *)0x14ae34;
  secp256k1_scalar_set_b32(sigr,(uchar *)r_00,(int *)&local_1bc);
  uVar10 = local_1bc;
  if (recid != (int *)0x0) {
    uVar19 = (ulong)local_1bc;
    a = &local_1a8.y;
    psStack_1d0 = (secp256k1_ge *)0x14ae48;
    secp256k1_fe_verify(a);
    if (local_1a8.y.normalized == 0) {
      psStack_1d0 = (secp256k1_ge *)secp256k1_ecmult_gen;
      secp256k1_ecdsa_sig_sign_cold_1();
      piStack_1e8 = recid;
      auStack_240 = (undefined1  [16])0x0;
      auStack_250 = (undefined1  [16])0x0;
      uStack_230 = 0;
      auStack_350 = (undefined1  [16])0x0;
      auStack_340 = (undefined1  [16])0x0;
      auStack_330 = (undefined1  [16])0x0;
      auStack_320 = (undefined1  [16])0x0;
      psStack_1f8 = sigs;
      psStack_1f0 = nonce;
      psStack_1e0 = sigr;
      uStack_1d8 = uVar19;
      psStack_1d0 = &local_1a8;
      secp256k1_scalar_add((secp256k1_scalar *)auStack_220,(secp256k1_scalar *)(a->n + 1),b_00);
      bVar16 = 0;
      uVar19 = 0;
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_220);
        *(int *)(auStack_250 + uVar19 * 4) =
             (int)(*(ulong *)(auStack_220 + (uVar19 >> 1 & 0x7fffffff) * 8) >> (bVar16 & 0x20));
        uVar19 = uVar19 + 1;
        bVar16 = bVar16 + 0x20;
      } while (uVar19 != 8);
      auStack_220._16_16_ = (undefined1  [16])0x0;
      auStack_220._0_16_ = (undefined1  [16])0x0;
      auStack_2c0._8_8_ = (secp256k1_scalar *)auStack_220;
      auStack_2c0._0_8_ = 0x4d430001;
      auStack_2c0._16_16_ = ZEXT816(0x20);
      auStack_2a0 = ZEXT816(0);
      psStack_308 = a + 3;
      lVar17 = 0x29a080;
      lVar14 = 0;
      uVar19 = 0;
      iVar11 = 0;
      psStack_300 = a;
      do {
        iVar12 = 0;
        uVar10 = 0;
        r_01 = (secp256k1_ge *)auStack_2c0;
        do {
          bVar5 = (byte)(iVar11 + iVar12) & 0x1f;
          bVar16 = (byte)iVar12 & 0x1f;
          uVar10 = (*(uint *)(auStack_250 + (ulong)((uint)(iVar11 + iVar12) >> 5) * 4) >> bVar5 |
                   *(uint *)(auStack_250 + (ulong)((uint)(iVar11 + iVar12) >> 5) * 4) <<
                   0x20 - bVar5) << ((byte)iVar12 & 0x1f) ^
                   uVar10 & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
          iVar12 = iVar12 + 1;
        } while (iVar12 != 6);
        flag = uVar10 >> 5 & 1;
        uVar15 = (ulong)(((-flag ^ uVar10) & 0x1f) << 6);
        uVar18 = 0;
        do {
          uVar10 = (uint)(uVar15 == uVar18);
          uVar3 = (ulong)((long)r_01 << 3) >> 0x33;
          uVar4 = (((long)r_01 << 3 | (ulong)r_01 >> 0x3d) << 0xd | uVar3) >> 3;
          uVar2 = uVar4 << 0x33;
          lVar1 = (long)(int)uVar10 + -1;
          lVar13 = -(long)(int)uVar10;
          auVar20._8_4_ = (int)lVar1;
          auVar20._0_8_ = lVar1;
          auVar20._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar23._8_4_ = (int)lVar13;
          auVar23._0_8_ = lVar13;
          auVar23._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auStack_350 = *(undefined1 (*) [16])(lVar17 + -0x30 + uVar18) & auVar23 |
                        auStack_350 & auVar20;
          auStack_340 = auVar23 & *(undefined1 (*) [16])(lVar17 + -0x20 + uVar18) |
                        auVar20 & auStack_340;
          uVar3 = (uVar2 | (uVar3 << 0x3d | uVar4) >> 0xd) << 3;
          uVar4 = uVar3 >> 0x33;
          uVar2 = ((uVar3 | uVar2 >> 0x3d) << 0xd | uVar4) >> 3;
          r_01 = (secp256k1_ge *)(uVar2 << 0x33 | (uVar4 << 0x3d | uVar2) >> 0xd);
          lVar1 = (long)(int)uVar10 + -1;
          lVar13 = -(long)(int)uVar10;
          auVar21._8_4_ = (int)lVar1;
          auVar21._0_8_ = lVar1;
          auVar21._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar24._8_4_ = (int)lVar13;
          auVar24._0_8_ = lVar13;
          auVar24._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auStack_330 = *(undefined1 (*) [16])(lVar17 + -0x10 + uVar18) & auVar24 |
                        auStack_330 & auVar21;
          auStack_320 = auVar24 & *(undefined1 (*) [16])(lVar17 + uVar18) | auVar21 & auStack_320;
          uVar18 = uVar18 + 0x40;
        } while (uVar18 != 0x800);
        uStack_2f8 = uVar19;
        secp256k1_ge_from_storage(r_01,(secp256k1_ge_storage *)auStack_350);
        secp256k1_fe_verify(&sStack_290);
        secp256k1_fe_verify_magnitude(&sStack_290,1);
        sStack_2f0.n[1] = 0x3ffffffffffffc - sStack_290.n[1];
        sStack_2f0.n[0] = 0x3ffffbfffff0bc - sStack_290.n[0];
        sStack_2f0.n[3] = 0x3ffffffffffffc - sStack_290.n[3];
        sStack_2f0.n[2] = 0x3ffffffffffffc - sStack_290.n[2];
        sStack_2f0._40_8_ = 2;
        sStack_2f0.n[4] = 0x3fffffffffffc - sStack_290.n[4];
        secp256k1_fe_verify(&sStack_2f0);
        secp256k1_fe_cmov(&sStack_290,&sStack_2f0,flag);
        if ((uStack_2f8 & 1) == 0) {
          secp256k1_gej_set_ge(r_00,(secp256k1_ge *)auStack_2c0);
          secp256k1_gej_rescale(r_00,psStack_308);
        }
        else {
          secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)auStack_2c0);
        }
        iVar11 = iVar11 + 6;
        lVar14 = lVar14 + 1;
        lVar17 = lVar17 + 0x800;
        uVar19 = CONCAT71((int7)(uVar15 >> 8),1);
      } while (lVar14 != 0x2b);
      secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)&psStack_300->magnitude);
      return 0;
    }
    *recid = ((uint)local_1a8.y.n[0] & 1) + uVar10 * 2;
  }
  psStack_1d0 = (secp256k1_ge *)0x14ae7a;
  secp256k1_scalar_mul(&local_108,sigr,local_1b8);
  psStack_1d0 = (secp256k1_ge *)0x14ae8a;
  secp256k1_scalar_add(&local_108,&local_108,local_1b0);
  psStack_1d0 = (secp256k1_ge *)0x14ae95;
  secp256k1_scalar_inverse(sigs,nonce);
  psStack_1d0 = (secp256k1_ge *)0x14aea3;
  secp256k1_scalar_mul(sigs,sigs,&local_108);
  local_108.d[2] = 0;
  local_108.d[3] = 0;
  local_108.d[0] = 0;
  local_108.d[1] = 0;
  local_138 = 0x4d430001;
  local_128 = 0x20;
  local_120 = 0;
  local_118 = 0;
  local_110 = 0;
  local_1c8 = 0;
  psStack_1d0 = (secp256k1_ge *)0x14af10;
  local_130 = (secp256k1_ge *)&local_108;
  memset(local_e8 + 0x20,0,0x98);
  local_1a8.x.n[0] = 0;
  local_1a8.x.n[1] = 0;
  local_1a8.x.n[2] = 0;
  local_1a8.x.n[3] = 0;
  local_1a8.x.n[4] = 0;
  local_1a8.x.magnitude = 0;
  local_1a8.x.normalized = 0;
  local_1a8.y.n[0] = 0;
  local_1a8.y.n[1] = 0;
  local_1a8.y.n[2] = 0;
  local_1a8.y.n[3] = 0;
  local_1a8.y.n[4] = 0;
  local_1a8.y.magnitude = 0;
  local_1a8.y.normalized = 0;
  local_1a8.infinity = 0;
  local_1a8._100_4_ = 0;
  local_130 = &local_1a8;
  local_138 = 0x4d430001;
  local_128 = 0x68;
  local_120 = 0;
  local_118 = 0;
  local_110 = 0;
  local_1c8 = 0;
  psStack_1d0 = (secp256k1_ge *)0x14afc3;
  uVar10 = secp256k1_scalar_is_high(sigs);
  psStack_1d0 = (secp256k1_ge *)0x14afcf;
  secp256k1_scalar_cond_negate(sigs,uVar10);
  if (recid != (int *)0x0) {
    *recid = *recid ^ uVar10;
  }
  psStack_1d0 = (secp256k1_ge *)0x14afe0;
  secp256k1_scalar_verify(sigr);
  uVar6 = sigr->d[0];
  uVar7 = sigr->d[1];
  uVar8 = sigr->d[2];
  uVar9 = sigr->d[3];
  psStack_1d0 = (secp256k1_ge *)0x14b00c;
  secp256k1_scalar_verify(sigs);
  auVar22._0_4_ = -(uint)((int)sigs->d[2] == 0 && (int)sigs->d[0] == 0);
  auVar22._4_4_ = -(uint)(*(int *)((long)sigs->d + 0x14) == 0 && *(int *)((long)sigs->d + 4) == 0);
  auVar22._8_4_ = -(uint)((int)sigs->d[3] == 0 && (int)sigs->d[1] == 0);
  auVar22._12_4_ =
       -(uint)(*(int *)((long)sigs->d + 0x1c) == 0 && *(int *)((long)sigs->d + 0xc) == 0);
  iVar11 = movmskps(extraout_EAX,auVar22);
  return (int)(iVar11 != 0xf && ((uVar9 != 0 || uVar7 != 0) || (uVar8 != 0 || uVar6 != 0)));
}

Assistant:

static int secp256k1_ecdsa_sig_sign(const secp256k1_ecmult_gen_context *ctx, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_scalar *seckey, const secp256k1_scalar *message, const secp256k1_scalar *nonce, int *recid) {
    unsigned char b[32];
    secp256k1_gej rp;
    secp256k1_ge r;
    secp256k1_scalar n;
    int overflow = 0;
    int high;

    secp256k1_ecmult_gen(ctx, &rp, nonce);
    secp256k1_ge_set_gej(&r, &rp);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_normalize(&r.y);
    secp256k1_fe_get_b32(b, &r.x);
    secp256k1_scalar_set_b32(sigr, b, &overflow);
    if (recid) {
        /* The overflow condition is cryptographically unreachable as hitting it requires finding the discrete log
         * of some P where P.x >= order, and only 1 in about 2^127 points meet this criteria.
         */
        *recid = (overflow << 1) | secp256k1_fe_is_odd(&r.y);
    }
    secp256k1_scalar_mul(&n, sigr, seckey);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, nonce);
    secp256k1_scalar_mul(sigs, sigs, &n);
    secp256k1_scalar_clear(&n);
    secp256k1_gej_clear(&rp);
    secp256k1_ge_clear(&r);
    high = secp256k1_scalar_is_high(sigs);
    secp256k1_scalar_cond_negate(sigs, high);
    if (recid) {
        *recid ^= high;
    }
    /* P.x = order is on the curve, so technically sig->r could end up being zero, which would be an invalid signature.
     * This is cryptographically unreachable as hitting it requires finding the discrete log of P.x = N.
     */
    return (int)(!secp256k1_scalar_is_zero(sigr)) & (int)(!secp256k1_scalar_is_zero(sigs));
}